

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int check_ihdr(spng_ihdr *ihdr,uint32_t max_width,uint32_t max_height)

{
  uint32_t max_height_local;
  uint32_t max_width_local;
  spng_ihdr *ihdr_local;
  
  if ((ihdr->width < 0x80000000) && (ihdr->width != 0)) {
    if ((ihdr->height < 0x80000000) && (ihdr->height != 0)) {
      if (max_width < ihdr->width) {
        ihdr_local._4_4_ = 7;
      }
      else if (max_height < ihdr->height) {
        ihdr_local._4_4_ = 8;
      }
      else {
        switch(ihdr->color_type) {
        case '\0':
          if (((ihdr->bit_depth != '\x01') && (ihdr->bit_depth != '\x02')) &&
             ((ihdr->bit_depth != '\x04' &&
              ((ihdr->bit_depth != '\b' && (ihdr->bit_depth != '\x10')))))) {
            return 9;
          }
          break;
        default:
          return 10;
        case '\x02':
        case '\x04':
        case '\x06':
          if ((ihdr->bit_depth != '\b') && (ihdr->bit_depth != '\x10')) {
            return 9;
          }
          break;
        case '\x03':
          if ((((ihdr->bit_depth != '\x01') && (ihdr->bit_depth != '\x02')) &&
              (ihdr->bit_depth != '\x04')) && (ihdr->bit_depth != '\b')) {
            return 9;
          }
        }
        if (ihdr->compression_method == '\0') {
          if (ihdr->filter_method == '\0') {
            if (ihdr->interlace_method < 2) {
              ihdr_local._4_4_ = 0;
            }
            else {
              ihdr_local._4_4_ = 0xd;
            }
          }
          else {
            ihdr_local._4_4_ = 0xc;
          }
        }
        else {
          ihdr_local._4_4_ = 0xb;
        }
      }
    }
    else {
      ihdr_local._4_4_ = 6;
    }
  }
  else {
    ihdr_local._4_4_ = 5;
  }
  return ihdr_local._4_4_;
}

Assistant:

static int check_ihdr(const struct spng_ihdr *ihdr, uint32_t max_width, uint32_t max_height)
{
    if(ihdr->width > spng_u32max || !ihdr->width) return SPNG_EWIDTH;
    if(ihdr->height > spng_u32max || !ihdr->height) return SPNG_EHEIGHT;

    if(ihdr->width > max_width) return SPNG_EUSER_WIDTH;
    if(ihdr->height > max_height) return SPNG_EUSER_HEIGHT;

    switch(ihdr->color_type)
    {
        case SPNG_COLOR_TYPE_GRAYSCALE:
        {
            if( !(ihdr->bit_depth == 1 || ihdr->bit_depth == 2 ||
                  ihdr->bit_depth == 4 || ihdr->bit_depth == 8 ||
                  ihdr->bit_depth == 16) )
                  return SPNG_EBIT_DEPTH;

            break;
        }
        case SPNG_COLOR_TYPE_TRUECOLOR:
        case SPNG_COLOR_TYPE_GRAYSCALE_ALPHA:
        case SPNG_COLOR_TYPE_TRUECOLOR_ALPHA:
        {
            if( !(ihdr->bit_depth == 8 || ihdr->bit_depth == 16) )
                return SPNG_EBIT_DEPTH;

            break;
        }
        case SPNG_COLOR_TYPE_INDEXED:
        {
            if( !(ihdr->bit_depth == 1 || ihdr->bit_depth == 2 ||
                  ihdr->bit_depth == 4 || ihdr->bit_depth == 8) )
                return SPNG_EBIT_DEPTH;

            break;
        }
        default: return SPNG_ECOLOR_TYPE;
    }

    if(ihdr->compression_method) return SPNG_ECOMPRESSION_METHOD;
    if(ihdr->filter_method) return SPNG_EFILTER_METHOD;

    if(ihdr->interlace_method > 1) return SPNG_EINTERLACE_METHOD;

    return 0;
}